

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAutoHandle.cxx
# Opt level: O3

void __thiscall auto_async_t::reset(auto_async_t *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->handleMutex);
  if (iVar1 == 0) {
    auto_handle_base_<uv_async_s>::reset((auto_handle_base_<uv_async_s> *)this);
    pthread_mutex_unlock((pthread_mutex_t *)&this->handleMutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void auto_async_t::reset()
{
  std::lock_guard<std::mutex> lock(handleMutex);
  auto_handle_base_<uv_async_t>::reset();
}